

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O3

FT_Error FT_Raccess_Get_HeaderInfo
                   (FT_Library library,FT_Stream stream,FT_Long rfork_offset,FT_Long *map_offset,
                   FT_Long *rdata_pos)

{
  bool bVar1;
  bool bVar2;
  FT_UShort FVar3;
  FT_Error FVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  byte local_68 [8];
  uchar head2 [16];
  int local_4c;
  byte local_48 [8];
  uchar head [16];
  
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->size < (ulong)rfork_offset) {
      return 0x55;
    }
  }
  else {
    uVar5 = (*stream->read)(stream,rfork_offset,(uchar *)0x0,0);
    if (uVar5 != 0) {
      return 0x55;
    }
  }
  stream->pos = rfork_offset;
  FVar4 = FT_Stream_Read(stream,local_48,0x10);
  if (FVar4 != 0) {
    return FVar4;
  }
  if ((char)(local_48[0] | local_48[4] | head[0] | head[4]) < '\0') {
    return 2;
  }
  uVar6 = (ulong)local_48[3] |
          (ulong)((uint)local_48[2] << 8 | (uint)local_48[1] << 0x10 | (uint)local_48[0] << 0x18);
  *rdata_pos = uVar6;
  uVar10 = (uint)local_48[7] |
           (uint)local_48[6] << 8 | (uint)local_48[5] << 0x10 | (uint)local_48[4] << 0x18;
  uVar11 = (ulong)uVar10;
  if (uVar10 == 0) {
    return 2;
  }
  uVar7 = (ulong)head[3] |
          (ulong)((uint)head[2] << 8 | (uint)head[1] << 0x10 | (uint)head[0] << 0x18);
  uVar8 = (ulong)((uint)head[6] << 8 | (uint)head[5] << 0x10 | (uint)head[4] << 0x18) |
          (ulong)head[7];
  if ((uint)uVar6 < uVar10) {
    if ((long)(uVar11 - uVar7) < (long)uVar6) {
      return 2;
    }
  }
  else if ((long)(uVar6 - uVar8) < (long)uVar11) {
    return 2;
  }
  if ((long)(uVar7 + uVar6 ^ 0x7fffffffffffffff) < rfork_offset) {
    return 2;
  }
  if ((long)(uVar8 + uVar11 ^ 0x7fffffffffffffff) < rfork_offset) {
    return 2;
  }
  if (stream->size < uVar7 + uVar6 + rfork_offset) {
    return 2;
  }
  uVar11 = uVar11 + rfork_offset;
  if (stream->size < uVar8 + uVar11) {
    return 2;
  }
  *rdata_pos = uVar6 + rfork_offset;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->size < uVar11) {
      return 0x55;
    }
  }
  else {
    uVar5 = (*stream->read)(stream,uVar11,(uchar *)0x0,0);
    if (uVar5 != 0) {
      return 0x55;
    }
  }
  stream->pos = uVar11;
  head2[7] = head[7] + '\x01';
  FVar4 = FT_Stream_Read(stream,local_68,0x10);
  if (FVar4 != 0) {
    return FVar4;
  }
  bVar2 = true;
  lVar9 = 0;
  bVar1 = true;
  do {
    if (local_68[lVar9] != 0) {
      bVar1 = false;
    }
    if (local_68[lVar9] != local_48[lVar9]) {
      bVar2 = false;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  if (!bVar1 && !bVar2) {
    return 2;
  }
  uVar6 = stream->pos + 8;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    local_4c = 0x55;
    if (stream->size < uVar6) goto LAB_001ef951;
  }
  else {
    uVar5 = (*stream->read)(stream,uVar6,(uchar *)0x0,0);
    local_4c = 0x55;
    if (uVar5 != 0) goto LAB_001ef951;
  }
  stream->pos = uVar6;
  local_4c = 0;
LAB_001ef951:
  FVar3 = FT_Stream_ReadUShort(stream,&local_4c);
  if (local_4c != 0) {
    return local_4c;
  }
  if (-1 < (short)FVar3) {
    uVar11 = uVar11 + (long)(short)FVar3;
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      if (stream->size < uVar11) {
        return 0x55;
      }
    }
    else {
      uVar5 = (*stream->read)(stream,uVar11,(uchar *)0x0,0);
      if (uVar5 != 0) {
        return 0x55;
      }
    }
    stream->pos = uVar11;
    *map_offset = uVar11;
    return 0;
  }
  return 2;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Raccess_Get_HeaderInfo( FT_Library  library,
                             FT_Stream   stream,
                             FT_Long     rfork_offset,
                             FT_Long    *map_offset,
                             FT_Long    *rdata_pos )
  {
    FT_Error       error;
    unsigned char  head[16], head2[16];
    FT_Long        map_pos, map_len, rdata_len;
    int            allzeros, allmatch, i;
    FT_Long        type_list;

    FT_UNUSED( library );


    error = FT_Stream_Seek( stream, (FT_ULong)rfork_offset );
    if ( error )
      return error;

    error = FT_Stream_Read( stream, (FT_Byte*)head, 16 );
    if ( error )
      return error;

    /* ensure positive values */
    if ( head[0]  >= 0x80 ||
         head[4]  >= 0x80 ||
         head[8]  >= 0x80 ||
         head[12] >= 0x80 )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos = ( head[ 0] << 24 ) |
                 ( head[ 1] << 16 ) |
                 ( head[ 2] <<  8 ) |
                   head[ 3];
    map_pos    = ( head[ 4] << 24 ) |
                 ( head[ 5] << 16 ) |
                 ( head[ 6] <<  8 ) |
                   head[ 7];
    rdata_len  = ( head[ 8] << 24 ) |
                 ( head[ 9] << 16 ) |
                 ( head[10] <<  8 ) |
                   head[11];
    map_len    = ( head[12] << 24 ) |
                 ( head[13] << 16 ) |
                 ( head[14] <<  8 ) |
                   head[15];

    /* the map must not be empty */
    if ( !map_pos )
      return FT_THROW( Unknown_File_Format );

    /* check whether rdata and map overlap */
    if ( *rdata_pos < map_pos )
    {
      if ( *rdata_pos > map_pos - rdata_len )
        return FT_THROW( Unknown_File_Format );
    }
    else
    {
      if ( map_pos > *rdata_pos - map_len )
        return FT_THROW( Unknown_File_Format );
    }

    /* check whether end of rdata or map exceeds stream size */
    if ( FT_LONG_MAX - rdata_len < *rdata_pos                               ||
         FT_LONG_MAX - map_len < map_pos                                    ||

         FT_LONG_MAX - ( *rdata_pos + rdata_len ) < rfork_offset            ||
         FT_LONG_MAX - ( map_pos + map_len ) < rfork_offset                 ||

         (FT_ULong)( rfork_offset + *rdata_pos + rdata_len ) > stream->size ||
         (FT_ULong)( rfork_offset + map_pos + map_len ) > stream->size      )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos += rfork_offset;
    map_pos    += rfork_offset;

    error = FT_Stream_Seek( stream, (FT_ULong)map_pos );
    if ( error )
      return error;

    head2[15] = (FT_Byte)( head[15] + 1 );       /* make it be different */

    error = FT_Stream_Read( stream, (FT_Byte*)head2, 16 );
    if ( error )
      return error;

    allzeros = 1;
    allmatch = 1;
    for ( i = 0; i < 16; i++ )
    {
      if ( head2[i] != 0 )
        allzeros = 0;
      if ( head2[i] != head[i] )
        allmatch = 0;
    }
    if ( !allzeros && !allmatch )
      return FT_THROW( Unknown_File_Format );

    /* If we have reached this point then it is probably a mac resource */
    /* file.  Now, does it contain any interesting resources?           */

    (void)FT_STREAM_SKIP( 4        /* skip handle to next resource map */
                          + 2      /* skip file resource number */
                          + 2 );   /* skip attributes */

    if ( FT_READ_SHORT( type_list ) )
      return error;
    if ( type_list < 0 )
      return FT_THROW( Unknown_File_Format );

    error = FT_Stream_Seek( stream, (FT_ULong)( map_pos + type_list ) );
    if ( error )
      return error;

    *map_offset = map_pos + type_list;
    return FT_Err_Ok;
  }